

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::
copyable_holder_caster<anurbs::NurbsCurveGeometry<2L>,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_>
::load_value(copyable_holder_caster<anurbs::NurbsCurveGeometry<2L>,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_>
             *this,value_and_holder *v_h)

{
  void **ppvVar1;
  byte bVar2;
  runtime_error *this_00;
  long *plVar3;
  long *plVar4;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar2 = v_h->inst->field_0x30;
  if ((bVar2 & 2) == 0) {
    bVar2 = (v_h->inst->field_1).nonsimple.status[v_h->index];
  }
  else {
    bVar2 = bVar2 >> 2;
  }
  if ((bVar2 & 1) != 0) {
    ppvVar1 = v_h->vh;
    (this->super_type_caster_base<anurbs::NurbsCurveGeometry<2L>_>).super_type_caster_generic.value
         = *ppvVar1;
    (this->holder).super___shared_ptr<anurbs::NurbsCurveGeometry<2L>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)ppvVar1[1];
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->holder).
                super___shared_ptr<anurbs::NurbsCurveGeometry<2L>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(ppvVar1 + 2));
    return true;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  type_id<std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>>();
  std::operator+(&local_40,
                 "Unable to cast from non-held to held instance (T& to Holder<T>) of type \'",
                 &local_60);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_80 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_80 == plVar4) {
    local_70 = *plVar4;
    lStack_68 = plVar3[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar4;
  }
  local_78 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_80);
  *(undefined ***)this_00 = &PTR__runtime_error_00383cb8;
  __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool holder_constructed() const {
        return inst->simple_layout
            ? inst->simple_holder_constructed
            : inst->nonsimple.status[index] & instance::status_holder_constructed;
    }